

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,S2ShapeIndex *index)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  int e;
  ulong uVar7;
  ShapeIterator it;
  int local_9c;
  int local_98;
  ShapeIterator local_88;
  char *local_78;
  char *local_70;
  ulong local_68;
  S2Point local_60;
  S2Point local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar6 = 0;
  do {
    if (iVar6 == 3) {
      return __return_storage_ptr__;
    }
    if (iVar6 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    local_88.shape_id_ = 0;
    local_88.index_ = (S2ShapeIndex *)this;
    uVar2 = (**(code **)(*(long *)this + 0x10))();
    local_78 = "  ";
    if (iVar6 == 0) {
      local_78 = "\n";
    }
    local_78 = local_78 + 1;
    local_70 = " | ";
    if (iVar6 == 2) {
      local_70 = "; ";
    }
    local_68 = (ulong)-(uint)(iVar6 != 1);
    local_9c = 0;
    while (it.shape_id_ = uVar2, it.index_ = (S2ShapeIndex *)this, it._12_4_ = 0,
          bVar1 = S2ShapeIndex::ShapeIterator::operator!=(&local_88,it), bVar1) {
      plVar4 = (long *)(**(code **)(*(long *)local_88.index_ + 0x18))
                                 (local_88.index_,local_88.shape_id_);
      if ((plVar4 != (long *)0x0) && (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == iVar6)
         ) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        for (local_98 = 0; iVar3 = (**(code **)(*plVar4 + 0x30))(plVar4), local_98 < iVar3;
            local_98 = local_98 + 1) {
          if (local_98 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar5 = (**(code **)(*plVar4 + 0x38))(plVar4,local_98);
          uVar7 = uVar5 & 0xffffffff;
          if (uVar5 >> 0x20 == 0) {
            if (iVar6 != 2) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_60,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
                         ,0x1e7,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)local_60.c_[1],"Check failed: (dim) == (2) ");
              abort();
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            (**(code **)(*plVar4 + 0x18))(&local_60,plVar4,uVar7);
            AppendVertex(&local_60,__return_storage_ptr__);
          }
          iVar3 = (int)local_68;
          for (; (int)uVar7 < (int)(uVar5 >> 0x20) + iVar3 + (int)uVar5;
              uVar7 = (ulong)((int)uVar7 + 1)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            (**(code **)(*plVar4 + 0x18))(&local_60,plVar4,uVar7);
            AppendVertex(&local_48,__return_storage_ptr__);
          }
          local_9c = local_9c + 1;
        }
      }
      local_88.shape_id_ = local_88.shape_id_ + 1;
    }
    if ((iVar6 == 1) || (iVar6 == 0 && 0 < local_9c)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

string ToString(const S2ShapeIndex& index) {
  string out;
  for (int dim = 0; dim < 3; ++dim) {
    if (dim > 0) out += "#";
    int count = 0;
    for (S2Shape* shape : index) {
      if (shape == nullptr || shape->dimension() != dim) continue;
      out += (count > 0) ? " | " : (dim > 0) ? " " : "";
      for (int i = 0; i < shape->num_chains(); ++i, ++count) {
        if (i > 0) out += (dim == 2) ? "; " : " | ";
        S2Shape::Chain chain = shape->chain(i);
        if (chain.length == 0) {
          S2_DCHECK_EQ(dim, 2);
          out += "full";
        } else {
          AppendVertex(shape->edge(chain.start).v0, &out);
        }
        int limit = chain.start + chain.length;
        if (dim != 1) --limit;
        for (int e = chain.start; e < limit; ++e) {
          out += ", ";
          AppendVertex(shape->edge(e).v1, &out);
        }
      }
    }
    // Example output: "# #", "0:0 # #", "# # 0:0, 0:1, 1:0"
    if (dim == 1 || (dim == 0 && count > 0)) out += " ";
  }
  return out;
}